

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmSystemTools::ParseArguments_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmSystemTools *this,char *command)

{
  cmSystemTools *pcVar1;
  cmSystemTools cVar2;
  cmSystemTools cVar3;
  bool bVar4;
  cmSystemTools *pcVar5;
  string arg;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arg.field_2._M_local_buf[0] = '\0';
  cVar2 = *this;
  if (cVar2 == (cmSystemTools)0x2f) {
LAB_00359aff:
    bVar4 = false;
  }
  else {
    cVar3 = this[1];
    if ((cVar3 != (cmSystemTools)0x3a) || (this[2] != (cmSystemTools)0x5c)) {
      if (cVar2 != (cmSystemTools)0x5c) {
        if ((((cVar2 != (cmSystemTools)0x27) && (cVar2 != (cmSystemTools)0x22)) ||
            (cVar3 == (cmSystemTools)0x2f)) || (this[2] != (cmSystemTools)0x3a)) goto LAB_00359aff;
        cVar3 = this[3];
      }
      if (cVar3 != (cmSystemTools)0x5c) goto LAB_00359aff;
    }
    bVar4 = true;
  }
LAB_00359b14:
  pcVar5 = this;
  if (cVar2 == (cmSystemTools)0x0) {
    std::__cxx11::string::~string((string *)&arg);
    return __return_storage_ptr__;
  }
  while ((pcVar5 = pcVar5 + 1, cVar2 == (cmSystemTools)0x20 || (cVar2 == (cmSystemTools)0x9))) {
    pcVar1 = this + 1;
    this = this + 1;
    cVar2 = *pcVar1;
  }
  std::__cxx11::string::assign((char *)&arg);
  cVar2 = *this;
  if (cVar2 != (cmSystemTools)0x0) {
    if (cVar2 == (cmSystemTools)0x22) {
      for (; (cVar2 = *pcVar5, cVar2 != (cmSystemTools)0x0 && (cVar2 != (cmSystemTools)0x22));
          pcVar5 = pcVar5 + 1) {
        std::__cxx11::string::append((ulong)&arg,'\x01');
      }
      this = pcVar5 + 1;
      if (cVar2 == (cmSystemTools)0x0) {
        this = pcVar5;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&arg);
    }
    else {
      if (cVar2 != (cmSystemTools)0x27) {
        do {
          if (cVar2 == (cmSystemTools)0x5c) {
            if (bVar4) goto LAB_00359ba6;
            if (this[1] == (cmSystemTools)0x0) goto LAB_00359bb4;
            std::__cxx11::string::append((ulong)&arg,'\x01');
            this = this + 2;
          }
          else {
            if (((byte)cVar2 < 0x21) && ((0x100000201U >> ((ulong)(byte)cVar2 & 0x3f) & 1) != 0))
            goto LAB_00359c25;
LAB_00359ba6:
            std::__cxx11::string::append((ulong)&arg,'\x01');
LAB_00359bb4:
            this = this + 1;
          }
          cVar2 = *this;
        } while( true );
      }
      for (; (cVar2 = *pcVar5, cVar2 != (cmSystemTools)0x0 && (cVar2 != (cmSystemTools)0x27));
          pcVar5 = pcVar5 + 1) {
        std::__cxx11::string::append((ulong)&arg,'\x01');
      }
      this = pcVar5 + 1;
      if (cVar2 == (cmSystemTools)0x0) {
        this = pcVar5;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&arg);
    }
  }
  goto LAB_00359c31;
LAB_00359c25:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&arg);
LAB_00359c31:
  cVar2 = *this;
  goto LAB_00359b14;
}

Assistant:

std::vector<std::string> cmSystemTools::ParseArguments(const char* command)
{
  std::vector<std::string> args;
  std::string arg;

  bool win_path = false;

  if ((command[0] != '/' && command[1] == ':' && command[2] == '\\') ||
      (command[0] == '\"' && command[1] != '/' && command[2] == ':'
       && command[3] == '\\') ||
      (command[0] == '\'' && command[1] != '/' && command[2] == ':'
       && command[3] == '\\') ||
      (command[0] == '\\' && command[1] == '\\'))
    {
    win_path = true;
    }
  // Split the command into an argv array.
  for(const char* c = command; *c;)
    {
    // Skip over whitespace.
    while(*c == ' ' || *c == '\t')
      {
      ++c;
      }
    arg = "";
    if(*c == '"')
      {
      // Parse a quoted argument.
      ++c;
      while(*c && *c != '"')
        {
        arg.append(1, *c);
        ++c;
        }
      if(*c)
        {
        ++c;
        }
      args.push_back(arg);
      }
    else if(*c == '\'')
      {
      // Parse a quoted argument.
      ++c;
      while(*c && *c != '\'')
        {
        arg.append(1, *c);
        ++c;
        }
      if(*c)
        {
        ++c;
        }
      args.push_back(arg);
      }
    else if(*c)
      {
      // Parse an unquoted argument.
      while(*c && *c != ' ' && *c != '\t')
        {
        if(*c == '\\' && !win_path)
          {
          ++c;
          if(*c)
            {
            arg.append(1, *c);
            ++c;
            }
          }
        else
          {
          arg.append(1, *c);
          ++c;
          }
        }
      args.push_back(arg);
      }
    }

  return args;
}